

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDescriptor.cpp
# Opt level: O2

void normVector(vector<float,_std::allocator<float>_> *v)

{
  float fVar1;
  pointer pfVar2;
  pointer pfVar3;
  int i;
  long lVar4;
  float fVar5;
  
  pfVar2 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  fVar5 = 0.0;
  for (lVar4 = 0;
      (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
            _M_finish - (long)pfVar2 >> 2 != lVar4; lVar4 = lVar4 + 1) {
    fVar1 = pfVar2[lVar4];
    fVar5 = fVar5 + fVar1 * fVar1;
  }
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  pfVar2 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pfVar3 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (lVar4 = 0; (long)pfVar3 - (long)pfVar2 >> 2 != lVar4; lVar4 = lVar4 + 1) {
    pfVar2[lVar4] = pfVar2[lVar4] / fVar5;
  }
  return;
}

Assistant:

void normVector(vector<float>& v) {
	float sum = 0.0F;
	for (int i = 0; i < v.size(); ++i) {
		sum += v[i] * v[i];
	}
	sum = sqrtf(sum);
	for (int i = 0; i < v.size(); ++i) {
		v[i] /= sum;
	}
}